

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O0

void PrintFinalStats(void *arkode_mem)

{
  undefined8 in_RDI;
  double dVar1;
  sunrealtype avdim;
  int flag;
  long nfeLS;
  long ncfl;
  long nps;
  long npe;
  long nli;
  long netf;
  long ncfn;
  long nni;
  long nsetups;
  long nfi;
  long nfe;
  long nst;
  long leniwLS;
  long lenrwLS;
  long leniw;
  long lenrw;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  void *in_stack_ffffffffffffff68;
  long local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  long local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  ARKodeGetWorkSpace(in_RDI,&local_10,&local_18);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetNumSteps(local_8,&local_30);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKStepGetNumRhsEvals(local_8,&local_38,&local_40);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetNumLinSolvSetups(local_8,&local_48);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetNumErrTestFails(local_8,&local_60);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetNumNonlinSolvIters(local_8,&local_50);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetNumNonlinSolvConvFails(local_8,&local_58);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetLinWorkSpace(local_8,&local_20,&local_28);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetNumLinIters(local_8,&local_68);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetNumPrecEvals(local_8,&local_70);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetNumPrecSolves(local_8,&local_78);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetNumLinConvFails(local_8,&local_80);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ARKodeGetNumLinRhsEvals(local_8,&local_88);
  check_flag(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  printf("\n\n Final statistics for this run:\n\n");
  printf(" ARKStep real workspace length         = %4ld \n",local_10);
  printf(" ARKStep integer workspace length      = %4ld \n",local_18);
  printf(" ARKLS real workspace length           = %4ld \n",local_20);
  printf(" ARKLS integer workspace length        = %4ld \n",local_28);
  printf(" Number of steps                       = %4ld \n",local_30);
  printf(" Number of f-s (explicit)              = %4ld \n",local_38);
  printf(" Number of f-s (implicit)              = %4ld \n",local_40);
  printf(" Number of f-s (SPGMR)                 = %4ld \n",local_88);
  printf(" Number of f-s (TOTAL)                 = %4ld \n",local_38 + local_88);
  printf(" Number of setups                      = %4ld \n",local_48);
  printf(" Number of nonlinear iterations        = %4ld \n",local_50);
  printf(" Number of linear iterations           = %4ld \n",local_68);
  printf(" Number of preconditioner evaluations  = %4ld \n",local_70);
  printf(" Number of preconditioner solves       = %4ld \n",local_78);
  printf(" Number of error test failures         = %4ld \n",local_60);
  printf(" Number of nonlinear conv. failures    = %4ld \n",local_58);
  printf(" Number of linear convergence failures = %4ld \n",local_80);
  if (local_50 < 1) {
    dVar1 = 0.0;
  }
  else {
    dVar1 = (double)local_68 / (double)local_50;
  }
  printf(" Average Krylov subspace dimension     = %.3f \n",dVar1);
  printf("\n\n--------------------------------------------------------------");
  printf("--------------\n");
  printf("--------------------------------------------------------------");
  printf("--------------\n");
  return;
}

Assistant:

static void PrintFinalStats(void* arkode_mem)
{
  long int lenrw, leniw;
  long int lenrwLS, leniwLS;
  long int nst, nfe, nfi, nsetups, nni, ncfn, netf;
  long int nli, npe, nps, ncfl, nfeLS;
  int flag;
  sunrealtype avdim;

  flag = ARKodeGetWorkSpace(arkode_mem, &lenrw, &leniw);
  check_flag(&flag, "ARKodeGetWorkSpace", 1);
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);

  flag = ARKodeGetLinWorkSpace(arkode_mem, &lenrwLS, &leniwLS);
  check_flag(&flag, "ARKodeGetLinWorkSpace", 1);
  flag = ARKodeGetNumLinIters(arkode_mem, &nli);
  check_flag(&flag, "ARKodeGetNumLinIters", 1);
  flag = ARKodeGetNumPrecEvals(arkode_mem, &npe);
  check_flag(&flag, "ARKodeGetNumPrecEvals", 1);
  flag = ARKodeGetNumPrecSolves(arkode_mem, &nps);
  check_flag(&flag, "ARKodeGetNumPrecSolves", 1);
  flag = ARKodeGetNumLinConvFails(arkode_mem, &ncfl);
  check_flag(&flag, "ARKodeGetNumLinConvFails", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);

  printf("\n\n Final statistics for this run:\n\n");
  printf(" ARKStep real workspace length         = %4ld \n", lenrw);
  printf(" ARKStep integer workspace length      = %4ld \n", leniw);
  printf(" ARKLS real workspace length           = %4ld \n", lenrwLS);
  printf(" ARKLS integer workspace length        = %4ld \n", leniwLS);
  printf(" Number of steps                       = %4ld \n", nst);
  printf(" Number of f-s (explicit)              = %4ld \n", nfe);
  printf(" Number of f-s (implicit)              = %4ld \n", nfi);
  printf(" Number of f-s (SPGMR)                 = %4ld \n", nfeLS);
  printf(" Number of f-s (TOTAL)                 = %4ld \n", nfe + nfeLS);
  printf(" Number of setups                      = %4ld \n", nsetups);
  printf(" Number of nonlinear iterations        = %4ld \n", nni);
  printf(" Number of linear iterations           = %4ld \n", nli);
  printf(" Number of preconditioner evaluations  = %4ld \n", npe);
  printf(" Number of preconditioner solves       = %4ld \n", nps);
  printf(" Number of error test failures         = %4ld \n", netf);
  printf(" Number of nonlinear conv. failures    = %4ld \n", ncfn);
  printf(" Number of linear convergence failures = %4ld \n", ncfl);
  avdim = (nni > 0) ? ((sunrealtype)nli) / ((sunrealtype)nni) : ZERO;
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf(" Average Krylov subspace dimension     = %.3Lf \n", avdim);
#else
  printf(" Average Krylov subspace dimension     = %.3f \n", avdim);
#endif
  printf("\n\n--------------------------------------------------------------");
  printf("--------------\n");
  printf("--------------------------------------------------------------");
  printf("--------------\n");
}